

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::DelKey
          (TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_> *this,int key)

{
  Node *src;
  bool bVar1;
  int iVar2;
  Node *this_00;
  Node *n;
  Node *pNStack_28;
  THashTraits<int> Traits;
  Node **mpp;
  Node *mp;
  int key_local;
  TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_> *this_local;
  
  this_00 = MainPosition(this,key);
  bVar1 = Node::IsNil(this_00);
  if (!bVar1) {
    iVar2 = THashTraits<int>::Compare((THashTraits<int> *)((long)&n + 7),(this_00->Pair).Key,key);
    if (iVar2 == 0) {
      if (this_00->Next == (Node *)0x0) {
        Node::SetNil(this_00);
      }
      else {
        src = this_00->Next;
        CopyNode(this,this_00,src);
        Node::SetNil(src);
      }
      this->NumUsed = this->NumUsed - 1;
    }
    else {
      mpp = &this_00->Next->Next;
      pNStack_28 = this_00;
      while( true ) {
        bVar1 = false;
        if (mpp != (Node **)0x0) {
          iVar2 = THashTraits<int>::Compare
                            ((THashTraits<int> *)((long)&n + 7),*(int *)(mpp + 1),key);
          bVar1 = iVar2 != 0;
        }
        if (!bVar1) break;
        pNStack_28 = (Node *)mpp;
        mpp = &(*mpp)->Next;
      }
      if (mpp != (Node **)0x0) {
        pNStack_28->Next = *mpp;
        Node::SetNil((Node *)mpp);
        this->NumUsed = this->NumUsed - 1;
      }
    }
  }
  return;
}

Assistant:

void DelKey(const KT key)
	{
		Node *mp = MainPosition(key), **mpp;
		HashTraits Traits;

		if (mp->IsNil())
		{
			/* the key is definitely not present, because there is nothing at its main position */
		}
		else if (!Traits.Compare(mp->Pair.Key, key)) /* the key is in its main position */
		{
			if (mp->Next != NULL)		/* move next node to its main position */
			{
				Node *n = mp->Next;
				mp->~Node();			/* deconstruct old node */
				CopyNode(mp, n);		/* copy next node */
				n->SetNil();			/* next node is now nil */
			}
			else
			{
				mp->~Node();
				mp->SetNil();			/* there is no chain, so main position is nil */
			}
			--NumUsed;
		}
		else	/* the key is either not present or not in its main position */
		{
			for (mpp = &mp->Next, mp = *mpp; mp != NULL && Traits.Compare(mp->Pair.Key, key); mpp = &mp->Next, mp = *mpp)
			{ }							/* look for the key */
			if (mp != NULL)				/* found it */
			{
				*mpp = mp->Next;		/* rechain so this node is skipped */
				mp->~Node();
				mp->SetNil();			/* because this node is now nil */
				--NumUsed;
			}
		}
	}